

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall MapWrapper::freeAllItems(MapWrapper *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *__range1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
  *in_stack_ffffffffffffffc8;
  LatencyItem *this_00;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_true>
  local_18 [3];
  
  local_18[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::__detail::operator!=(local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
             ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                          *)0x105060);
    this_00 = ppVar2->second;
    if (this_00 != (LatencyItem *)0x0) {
      LatencyItem::~LatencyItem(this_00);
      operator_delete(this_00);
    }
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>,_false,_true>
                  *)this_00);
  }
  return;
}

Assistant:

void freeAllItems() {
        for (auto& entry : map) {
            delete entry.second;
        }
    }